

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  byte bVar1;
  uchar value;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  Message m;
  string local_50;
  
  Message::Message(&m);
  uVar3 = 0;
  do {
    if (str->_M_string_length <= uVar3) {
      StringStreamToString(__return_storage_ptr__,(stringstream *)m.ss_.ptr_);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&m.ss_);
      return __return_storage_ptr__;
    }
    bVar1 = (str->_M_dataplus)._M_p[uVar3];
    if (bVar1 == 0x22) {
      if (!is_attribute) {
        std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),'\"');
        goto LAB_0012d4e3;
      }
      pcVar2 = "&quot;";
LAB_0012d4de:
      std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),pcVar2);
    }
    else {
      if (bVar1 == 0x26) {
        pcVar2 = "&amp;";
        goto LAB_0012d4de;
      }
      if (bVar1 != 0x27) {
        if (bVar1 == 0x3e) {
          pcVar2 = "&gt;";
        }
        else {
          if (bVar1 != 0x3c) {
            uVar4 = (uint)bVar1;
            if (('\x1f' < (char)bVar1) || ((bVar1 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0))))
            {
              if ((is_attribute) && ((uVar4 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0)))) {
                std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),"&#x");
                String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)uVar4,value);
                std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),(string *)&local_50);
                std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),";");
                std::__cxx11::string::~string((string *)&local_50);
              }
              else {
                std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),bVar1);
              }
            }
            goto LAB_0012d4e3;
          }
          pcVar2 = "&lt;";
        }
        goto LAB_0012d4de;
      }
      if (is_attribute) {
        pcVar2 = "&apos;";
        goto LAB_0012d4de;
      }
      std::operator<<((ostream *)((long)m.ss_.ptr_ + 0x10),'\'');
    }
LAB_0012d4e3:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}